

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

char * str_unescape(char *str)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  size_t len_1;
  size_t len;
  char *pos;
  char *write;
  char *read;
  char *str_local;
  
  pos = str;
  write = str;
  while( true ) {
    if (*write == '\0') {
      return str;
    }
    pcVar2 = strchr(write,0x5c);
    if (pcVar2 < write) break;
    sVar3 = (long)pcVar2 - (long)write;
    memmove(pos,write,sVar3);
    pcVar4 = pos + sVar3;
    pcVar2 = write + sVar3 + 1;
    cVar1 = *pcVar2;
    if (cVar1 == 'n') {
      *pcVar4 = '\n';
    }
    else if (cVar1 == 'r') {
      *pcVar4 = '\r';
    }
    else if (cVar1 == 't') {
      *pcVar4 = '\t';
    }
    else {
      *pcVar4 = *pcVar2;
    }
    pos = pcVar4 + 1;
    *pos = '\0';
    write = pcVar2 + 1;
  }
  sVar3 = strlen(write);
  memmove(pos,write,sVar3);
  pos[sVar3] = '\0';
  return str;
}

Assistant:

char *str_unescape(char *str) {
    char *read = str, *write = str;
    while (*read) {
        char * pos = strchr(read, '\\');
        if (pos >= read) {
            size_t len = (size_t)(pos - read);
            memmove(write, read, len);
            write += len;
            read += (len + 1);
            switch (read[0]) {
            case 'r':
                *write++ = '\r';
                break;
            case 'n':
                *write++ = '\n';
                break;
            case 't':
                *write++ = '\t';
                break;
            default: 
                *write++ = read[0];
            }
            *write = 0;
            ++read;
        }
        else {
            size_t len = strlen(read);
            memmove(write, read, len);
            write[len] = 0;
            break;
        }
    }
    return str;
}